

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall QDirListing::QDirListing(QDirListing *this,QString *path,IteratorFlags flags)

{
  long lVar1;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var2;
  undefined4 in_EDX;
  QDirListingPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff68;
  QFileSystemEntry *in_stack_ffffffffffffff70;
  QDirListingPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  _Var2._M_head_impl = (QAbstractFileEngine *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(this_00);
  (in_RDI->engine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = _Var2._M_head_impl;
  QFileSystemEntry::QFileSystemEntry
            (in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->m_filePath);
  QFileSystemEntry::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  QFileSystemEntry::~QFileSystemEntry(in_stack_ffffffffffffff70);
  *(undefined4 *)
   &(in_RDI->engine)._M_t.
    super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
    super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
    super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl[10]._vptr_QAbstractFileEngine =
       in_EDX;
  QDirListingPrivate::init
            ((QDirListingPrivate *)
             (in_RDI->engine)._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, IteratorFlags flags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->iteratorFlags = flags;
    d->init();
}